

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender __thiscall
fmt::v8::detail::write<char,fmt::v8::appender>
          (detail *this,appender out,basic_string_view<char> s,basic_format_specs<char> *specs)

{
  type tVar1;
  size_t width;
  appender aVar2;
  basic_format_specs<char> *specs_00;
  char *size_00;
  size_t size;
  string_view s_00;
  anon_class_16_2_3f014a30 local_30;
  
  specs_00 = (basic_format_specs<char> *)s.size_;
  size_00 = s.data_;
  if (-1 < specs_00->precision) {
    tVar1 = to_unsigned<int>(specs_00->precision);
    if ((char *)(ulong)tVar1 < size_00) {
      tVar1 = to_unsigned<int>(specs_00->precision);
      if ((char *)(ulong)tVar1 <= size_00) {
        size_00 = (char *)(ulong)tVar1;
      }
    }
  }
  if (specs_00->width == 0) {
    width = 0;
  }
  else {
    s_00.size_ = (size_t)size_00;
    s_00.data_ = (char *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    width = compute_width(s_00);
  }
  local_30.data = (char *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_30.size = (size_t)size_00;
  aVar2 = write_padded<(fmt::v8::align::type)1,fmt::v8::appender,char,fmt::v8::detail::write<char,fmt::v8::appender>(fmt::v8::appender,fmt::v8::basic_string_view<char>,fmt::v8::basic_format_specs<char>const&)::_lambda(fmt::v8::appender)_1_>
                    ((appender)this,specs_00,(size_t)size_00,width,&local_30);
  return (appender)aVar2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const basic_format_specs<Char>& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width =
      specs.width != 0 ? compute_width(basic_string_view<Char>(data, size)) : 0;
  return write_padded(out, specs, size, width,
                      [=](reserve_iterator<OutputIt> it) {
                        return copy_str<Char>(data, data + size, it);
                      });
}